

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void DoFilter4_SSE2(__m128i *p1,__m128i *p0,__m128i *q0,__m128i *q1,__m128i *mask,int hev_thresh)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  __m128i *in_RCX;
  __m128i *in_RDX;
  __m128i *in_RSI;
  __m128i *in_RDI;
  ulong *in_R8;
  int in_R9D;
  char cVar10;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  __m128i alVar13;
  char cVar28;
  __m128i t3;
  __m128i t2;
  __m128i t1;
  __m128i not_hev;
  __m128i k4;
  __m128i k3;
  __m128i k64;
  __m128i sign_bit;
  __m128i zero;
  undefined1 local_488 [2];
  char cStack_486;
  char cStack_485;
  char cStack_484;
  char cStack_483;
  char cStack_482;
  char cStack_481;
  undefined8 uStack_480;
  __m128i local_478;
  undefined8 local_468;
  undefined8 uStack_460;
  ulong local_458;
  ulong uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  ulong local_418;
  ulong uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  ulong *local_3f0;
  __m128i *local_3e8;
  __m128i *local_3e0;
  __m128i *local_3d8;
  __m128i *local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined1 local_3ac;
  undefined1 local_3ab;
  undefined1 local_3aa;
  undefined1 local_3a9;
  ulong local_388;
  ulong uStack_380;
  ulong local_378;
  ulong uStack_370;
  ulong local_368;
  ulong uStack_360;
  undefined1 local_358;
  undefined1 local_357;
  undefined1 local_356;
  undefined1 local_355;
  undefined1 local_354;
  undefined1 local_353;
  undefined1 local_352;
  undefined1 local_351;
  undefined1 local_350;
  undefined1 local_34f;
  undefined1 local_34e;
  undefined1 local_34d;
  undefined1 local_34c;
  undefined1 local_34b;
  undefined1 local_34a;
  undefined1 local_349;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined1 local_338;
  undefined1 local_337;
  undefined1 local_336;
  undefined1 local_335;
  undefined1 local_334;
  undefined1 local_333;
  undefined1 local_332;
  undefined1 local_331;
  undefined1 local_330;
  undefined1 local_32f;
  undefined1 local_32e;
  undefined1 local_32d;
  undefined1 local_32c;
  undefined1 local_32b;
  undefined1 local_32a;
  undefined1 local_329;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined1 local_318;
  undefined1 local_317;
  undefined1 local_316;
  undefined1 local_315;
  undefined1 local_314;
  undefined1 local_313;
  undefined1 local_312;
  undefined1 local_311;
  undefined1 local_310;
  undefined1 local_30f;
  undefined1 local_30e;
  undefined1 local_30d;
  undefined1 local_30c;
  undefined1 local_30b;
  undefined1 local_30a;
  undefined1 local_309;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined1 local_2f8;
  undefined1 local_2f7;
  undefined1 local_2f6;
  undefined1 local_2f5;
  undefined1 local_2f4;
  undefined1 local_2f3;
  undefined1 local_2f2;
  undefined1 local_2f1;
  undefined1 local_2f0;
  undefined1 local_2ef;
  undefined1 local_2ee;
  undefined1 local_2ed;
  undefined1 local_2ec;
  undefined1 local_2eb;
  undefined1 local_2ea;
  undefined1 local_2e9;
  ulong local_268;
  ulong uStack_260;
  ulong local_258;
  ulong uStack_250;
  ulong local_248;
  ulong uStack_240;
  ulong local_238;
  ulong uStack_230;
  ulong local_228;
  ulong uStack_220;
  ulong local_218;
  ulong uStack_210;
  ulong local_208;
  ulong uStack_200;
  ulong local_1f8;
  ulong uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  longlong local_188;
  longlong lStack_180;
  longlong local_178;
  longlong lStack_170;
  longlong local_168;
  longlong lStack_160;
  longlong local_158;
  longlong lStack_150;
  undefined8 local_108;
  undefined8 uStack_100;
  ulong local_f8;
  ulong uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  ulong local_d8;
  ulong uStack_d0;
  longlong local_c8;
  longlong lStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  longlong local_a8;
  longlong lStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  longlong local_88;
  longlong lStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  char local_68;
  char cStack_67;
  char cStack_66;
  char cStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  char cStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  char cStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  char cStack_59;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  undefined1 local_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 uStack_41;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  char local_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char cStack_19;
  
  local_3c8 = 0;
  uStack_3c0 = 0;
  local_408 = 0;
  uStack_400 = 0;
  local_3a9 = 0x80;
  local_349 = 0x80;
  local_34a = 0x80;
  local_34b = 0x80;
  local_34c = 0x80;
  local_34d = 0x80;
  local_34e = 0x80;
  local_34f = 0x80;
  local_350 = 0x80;
  local_351 = 0x80;
  local_352 = 0x80;
  local_353 = 0x80;
  local_354 = 0x80;
  local_355 = 0x80;
  local_356 = 0x80;
  local_357 = 0x80;
  local_358 = 0x80;
  local_418 = 0x8080808080808080;
  uStack_410 = 0x8080808080808080;
  local_3aa = 0x40;
  local_329 = 0x40;
  local_32a = 0x40;
  local_32b = 0x40;
  local_32c = 0x40;
  local_32d = 0x40;
  local_32e = 0x40;
  local_32f = 0x40;
  local_330 = 0x40;
  local_331 = 0x40;
  local_332 = 0x40;
  local_333 = 0x40;
  local_334 = 0x40;
  local_335 = 0x40;
  local_336 = 0x40;
  local_337 = 0x40;
  local_338 = 0x40;
  local_428 = 0x4040404040404040;
  uStack_420 = 0x4040404040404040;
  local_3ab = 3;
  local_309 = 3;
  local_30a = 3;
  local_30b = 3;
  local_30c = 3;
  local_30d = 3;
  local_30e = 3;
  local_30f = 3;
  local_310 = 3;
  local_311 = 3;
  local_312 = 3;
  local_313 = 3;
  local_314 = 3;
  local_315 = 3;
  local_316 = 3;
  local_317 = 3;
  local_318 = 3;
  local_438 = 0x303030303030303;
  uStack_430 = 0x303030303030303;
  local_3ac = 4;
  local_2e9 = 4;
  local_2ea = 4;
  local_2eb = 4;
  local_2ec = 4;
  local_2ed = 4;
  local_2ee = 4;
  local_2ef = 4;
  local_2f0 = 4;
  local_2f1 = 4;
  local_2f2 = 4;
  local_2f3 = 4;
  local_2f4 = 4;
  local_2f5 = 4;
  local_2f6 = 4;
  local_2f7 = 4;
  local_2f8 = 4;
  local_448 = 0x404040404040404;
  uStack_440 = 0x404040404040404;
  local_3f0 = in_R8;
  local_3e8 = in_RCX;
  local_3e0 = in_RDX;
  local_3d8 = in_RSI;
  local_3d0 = in_RDI;
  local_368 = local_418;
  uStack_360 = uStack_410;
  local_348 = local_428;
  uStack_340 = uStack_420;
  local_328 = local_438;
  uStack_320 = uStack_430;
  local_308 = local_448;
  uStack_300 = uStack_440;
  GetNotHEV_SSE2(in_RDI,in_RSI,in_RDX,in_RCX,in_R9D,(__m128i *)&local_458);
  local_1f8 = (*local_3d0)[0];
  uStack_1f0 = (*local_3d0)[1];
  local_208 = local_418;
  uStack_200 = uStack_410;
  (*local_3d0)[0] = local_1f8 ^ local_418;
  (*local_3d0)[1] = uStack_1f0 ^ uStack_410;
  local_218 = (*local_3d8)[0];
  uStack_210 = (*local_3d8)[1];
  local_228 = local_418;
  uStack_220 = uStack_410;
  (*local_3d8)[0] = local_218 ^ local_418;
  (*local_3d8)[1] = uStack_210 ^ uStack_410;
  local_238 = (*local_3e0)[0];
  uStack_230 = (*local_3e0)[1];
  local_248 = local_418;
  uStack_240 = uStack_410;
  (*local_3e0)[0] = local_238 ^ local_418;
  (*local_3e0)[1] = uStack_230 ^ uStack_410;
  local_258 = (*local_3e8)[0];
  uStack_250 = (*local_3e8)[1];
  local_268 = local_418;
  uStack_260 = uStack_410;
  (*local_3e8)[0] = local_258 ^ local_418;
  (*local_3e8)[1] = uStack_250 ^ uStack_410;
  local_158 = (*local_3d0)[0];
  lStack_150 = (*local_3d0)[1];
  local_168 = (*local_3e8)[0];
  lStack_160 = (*local_3e8)[1];
  auVar11 = psubsb((undefined1  [16])*local_3d0,(undefined1  [16])*local_3e8);
  local_468 = auVar11._0_8_;
  uStack_460 = auVar11._8_8_;
  local_1d8 = local_458;
  uVar1 = local_1d8;
  uStack_1d0 = uStack_450;
  uVar9 = uStack_1d0;
  local_1e8 = local_468;
  uVar7 = local_1e8;
  uStack_1e0 = uStack_460;
  uVar8 = uStack_1e0;
  local_1d8._0_4_ = (uint)local_458;
  local_1d8._4_4_ = (uint)(local_458 >> 0x20);
  uStack_1d0._0_4_ = (uint)uStack_450;
  uStack_1d0._4_4_ = (uint)(uStack_450 >> 0x20);
  local_1e8._0_4_ = auVar11._0_4_;
  local_1e8._4_4_ = auVar11._4_4_;
  uStack_1e0._0_4_ = auVar11._8_4_;
  uStack_1e0._4_4_ = auVar11._12_4_;
  local_468 = CONCAT44((local_1d8._4_4_ ^ 0xffffffff) & local_1e8._4_4_,
                       ((uint)local_1d8 ^ 0xffffffff) & (uint)local_1e8);
  uStack_460._0_4_ = ((uint)uStack_1d0 ^ 0xffffffff) & (uint)uStack_1e0;
  uStack_460._4_4_ = (uStack_1d0._4_4_ ^ 0xffffffff) & uStack_1e0._4_4_;
  local_178 = (*local_3e0)[0];
  lStack_170 = (*local_3e0)[1];
  local_188 = (*local_3d8)[0];
  lStack_180 = (*local_3d8)[1];
  auVar11 = psubsb((undefined1  [16])*local_3e0,(undefined1  [16])*local_3d8);
  local_478[0] = auVar11._0_8_;
  local_478[1] = auVar11._8_8_;
  local_78 = local_468;
  uStack_70 = uStack_460;
  local_88 = local_478[0];
  lStack_80 = local_478[1];
  auVar6._8_8_ = uStack_460;
  auVar6._0_8_ = local_468;
  auVar12 = paddsb(auVar6,auVar11);
  local_468 = auVar12._0_8_;
  uStack_460 = auVar12._8_8_;
  local_98 = local_468;
  uStack_90 = uStack_460;
  local_a8 = local_478[0];
  lStack_a0 = local_478[1];
  auVar12 = paddsb(auVar12,auVar11);
  local_468 = auVar12._0_8_;
  uStack_460 = auVar12._8_8_;
  local_b8 = local_468;
  uStack_b0 = uStack_460;
  local_c8 = local_478[0];
  lStack_c0 = local_478[1];
  auVar11 = paddsb(auVar12,auVar11);
  local_468 = auVar11._0_8_;
  uStack_460 = auVar11._8_8_;
  local_388 = *local_3f0;
  uStack_380 = local_3f0[1];
  local_378 = local_468;
  uStack_370 = uStack_460;
  local_f8 = local_468 & local_388;
  uStack_f0 = uStack_460 & uStack_380;
  uStack_460 = uStack_f0;
  local_468 = local_f8;
  local_e8 = local_438;
  uStack_e0 = uStack_430;
  auVar5._8_8_ = uStack_f0;
  auVar5._0_8_ = local_f8;
  auVar4._8_8_ = uStack_430;
  auVar4._0_8_ = local_438;
  local_478 = (__m128i)paddsb(auVar5,auVar4);
  local_108 = local_448;
  uStack_100 = uStack_440;
  auVar3._8_8_ = uStack_f0;
  auVar3._0_8_ = local_f8;
  auVar2._8_8_ = uStack_440;
  auVar2._0_8_ = local_448;
  _local_488 = (__m128i)paddsb(auVar3,auVar2);
  local_1e8 = uVar7;
  uStack_1e0 = uVar8;
  local_1d8 = uVar1;
  uStack_1d0 = uVar9;
  local_d8 = local_f8;
  uStack_d0 = uStack_f0;
  SignedShift8b_SSE2(&local_478);
  SignedShift8b_SSE2((__m128i *)local_488);
  alVar13 = (__m128i)paddsb((undefined1  [16])*local_3d8,(undefined1  [16])local_478);
  *local_3d8 = alVar13;
  alVar13 = (__m128i)psubsb((undefined1  [16])*local_3e0,(undefined1  [16])_local_488);
  *local_3e0 = alVar13;
  uVar1 = (*local_3d8)[1];
  (*local_3d8)[0] = (*local_3d8)[0] ^ local_418;
  (*local_3d8)[1] = uVar1 ^ uStack_410;
  uVar1 = (*local_3e0)[1];
  (*local_3e0)[0] = (*local_3e0)[0] ^ local_418;
  (*local_3e0)[1] = uVar1 ^ uStack_410;
  local_58 = local_488[0];
  cStack_57 = local_488[1];
  cStack_56 = local_488[2];
  cStack_55 = local_488[3];
  cStack_54 = local_488[4];
  cStack_53 = local_488[5];
  cStack_52 = local_488[6];
  cStack_51 = local_488[7];
  cStack_50 = local_488[8];
  cStack_4f = local_488[9];
  cStack_4e = local_488[10];
  cStack_4d = local_488[0xb];
  cStack_4c = local_488[0xc];
  cStack_4b = local_488[0xd];
  cStack_4a = local_488[0xe];
  cStack_49 = local_488[0xf];
  local_68 = (char)local_418;
  cStack_67 = (char)(local_418 >> 8);
  cStack_66 = (char)(local_418 >> 0x10);
  cStack_65 = (char)(local_418 >> 0x18);
  cStack_64 = (char)(local_418 >> 0x20);
  cStack_63 = (char)(local_418 >> 0x28);
  cStack_62 = (char)(local_418 >> 0x30);
  cStack_61 = (char)(local_418 >> 0x38);
  cStack_60 = (char)uStack_410;
  cStack_5f = (char)(uStack_410 >> 8);
  cStack_5e = (char)(uStack_410 >> 0x10);
  cStack_5d = (char)(uStack_410 >> 0x18);
  cStack_5c = (char)(uStack_410 >> 0x20);
  cStack_5b = (char)(uStack_410 >> 0x28);
  cStack_5a = (char)(uStack_410 >> 0x30);
  cStack_59 = (char)(uStack_410 >> 0x38);
  local_48 = (undefined1)local_408;
  uStack_47 = (undefined1)((ulong)local_408 >> 8);
  uStack_46 = (undefined1)((ulong)local_408 >> 0x10);
  uStack_45 = (undefined1)((ulong)local_408 >> 0x18);
  uStack_44 = (undefined1)((ulong)local_408 >> 0x20);
  uStack_43 = (undefined1)((ulong)local_408 >> 0x28);
  uStack_42 = (undefined1)((ulong)local_408 >> 0x30);
  uStack_41 = (undefined1)((ulong)local_408 >> 0x38);
  uStack_40 = (undefined1)uStack_400;
  uStack_3f = (undefined1)((ulong)uStack_400 >> 8);
  uStack_3e = (undefined1)((ulong)uStack_400 >> 0x10);
  uStack_3d = (undefined1)((ulong)uStack_400 >> 0x18);
  uStack_3c = (undefined1)((ulong)uStack_400 >> 0x20);
  uStack_3b = (undefined1)((ulong)uStack_400 >> 0x28);
  uStack_3a = (undefined1)((ulong)uStack_400 >> 0x30);
  uStack_39 = (undefined1)((ulong)uStack_400 >> 0x38);
  cVar10 = pavgb(local_58 + local_68,local_48);
  cVar14 = pavgb(cStack_57 + cStack_67,uStack_47);
  cVar15 = pavgb(cStack_56 + cStack_66,uStack_46);
  cVar16 = pavgb(cStack_55 + cStack_65,uStack_45);
  cVar17 = pavgb(cStack_54 + cStack_64,uStack_44);
  cVar18 = pavgb(cStack_53 + cStack_63,uStack_43);
  cVar19 = pavgb(cStack_52 + cStack_62,uStack_42);
  cVar20 = pavgb(cStack_51 + cStack_61,uStack_41);
  cVar21 = pavgb(cStack_50 + cStack_60,uStack_40);
  cVar22 = pavgb(cStack_4f + cStack_5f,uStack_3f);
  cVar23 = pavgb(cStack_4e + cStack_5e,uStack_3e);
  cVar24 = pavgb(cStack_4d + cStack_5d,uStack_3d);
  cVar25 = pavgb(cStack_4c + cStack_5c,uStack_3c);
  cVar26 = pavgb(cStack_4b + cStack_5b,uStack_3b);
  cVar27 = pavgb(cStack_4a + cStack_5a,uStack_3a);
  cVar28 = pavgb(cStack_49 + cStack_59,uStack_39);
  local_28 = (char)local_428;
  cStack_27 = (char)((ulong)local_428 >> 8);
  cStack_26 = (char)((ulong)local_428 >> 0x10);
  cStack_25 = (char)((ulong)local_428 >> 0x18);
  cStack_24 = (char)((ulong)local_428 >> 0x20);
  cStack_23 = (char)((ulong)local_428 >> 0x28);
  cStack_22 = (char)((ulong)local_428 >> 0x30);
  cStack_21 = (char)((ulong)local_428 >> 0x38);
  cStack_20 = (char)uStack_420;
  cStack_1f = (char)((ulong)uStack_420 >> 8);
  cStack_1e = (char)((ulong)uStack_420 >> 0x10);
  cStack_1d = (char)((ulong)uStack_420 >> 0x18);
  cStack_1c = (char)((ulong)uStack_420 >> 0x20);
  cStack_1b = (char)((ulong)uStack_420 >> 0x28);
  cStack_1a = (char)((ulong)uStack_420 >> 0x30);
  cStack_19 = (char)((ulong)uStack_420 >> 0x38);
  local_488 = (undefined1  [2])CONCAT11(cVar14 - cStack_27,cVar10 - local_28);
  _local_488 = CONCAT12(cVar15 - cStack_26,local_488);
  _local_488 = CONCAT13(cVar16 - cStack_25,_local_488);
  _local_488 = CONCAT14(cVar17 - cStack_24,_local_488);
  _local_488 = CONCAT15(cVar18 - cStack_23,_local_488);
  _local_488 = CONCAT16(cVar19 - cStack_22,_local_488);
  _local_488 = CONCAT17(cVar20 - cStack_21,_local_488);
  uStack_480._0_1_ = cVar21 - cStack_20;
  uStack_480._1_1_ = cVar22 - cStack_1f;
  uStack_480._2_1_ = cVar23 - cStack_1e;
  uStack_480._3_1_ = cVar24 - cStack_1d;
  uStack_480._4_1_ = cVar25 - cStack_1c;
  uStack_480._5_1_ = cVar26 - cStack_1b;
  uStack_480._6_1_ = cVar27 - cStack_1a;
  uStack_480._7_1_ = cVar28 - cStack_19;
  auVar11._8_8_ = uStack_450 & uStack_480;
  auVar11._0_8_ = local_458 & _local_488;
  alVar13 = (__m128i)psubsb((undefined1  [16])*local_3e8,auVar11);
  *local_3e8 = alVar13;
  auVar12._8_8_ = uStack_450 & uStack_480;
  auVar12._0_8_ = local_458 & _local_488;
  alVar13 = (__m128i)paddsb((undefined1  [16])*local_3d0,auVar12);
  *local_3d0 = alVar13;
  uVar1 = (*local_3d0)[1];
  (*local_3d0)[0] = (*local_3d0)[0] ^ local_418;
  (*local_3d0)[1] = uVar1 ^ uStack_410;
  uVar1 = (*local_3e8)[1];
  (*local_3e8)[0] = (*local_3e8)[0] ^ local_418;
  (*local_3e8)[1] = uVar1 ^ uStack_410;
  return;
}

Assistant:

static WEBP_INLINE void DoFilter4_SSE2(__m128i* const p1, __m128i* const p0,
                                       __m128i* const q0, __m128i* const q1,
                                       const __m128i* const mask,
                                       int hev_thresh) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i sign_bit = _mm_set1_epi8((char)0x80);
  const __m128i k64 = _mm_set1_epi8(64);
  const __m128i k3 = _mm_set1_epi8(3);
  const __m128i k4 = _mm_set1_epi8(4);
  __m128i not_hev;
  __m128i t1, t2, t3;

  // compute hev mask
  GetNotHEV_SSE2(p1, p0, q0, q1, hev_thresh, &not_hev);

  // convert to signed values
  FLIP_SIGN_BIT4(*p1, *p0, *q0, *q1);

  t1 = _mm_subs_epi8(*p1, *q1);        // p1 - q1
  t1 = _mm_andnot_si128(not_hev, t1);  // hev(p1 - q1)
  t2 = _mm_subs_epi8(*q0, *p0);        // q0 - p0
  t1 = _mm_adds_epi8(t1, t2);          // hev(p1 - q1) + 1 * (q0 - p0)
  t1 = _mm_adds_epi8(t1, t2);          // hev(p1 - q1) + 2 * (q0 - p0)
  t1 = _mm_adds_epi8(t1, t2);          // hev(p1 - q1) + 3 * (q0 - p0)
  t1 = _mm_and_si128(t1, *mask);       // mask filter values we don't care about

  t2 = _mm_adds_epi8(t1, k3);        // 3 * (q0 - p0) + hev(p1 - q1) + 3
  t3 = _mm_adds_epi8(t1, k4);        // 3 * (q0 - p0) + hev(p1 - q1) + 4
  SignedShift8b_SSE2(&t2);           // (3 * (q0 - p0) + hev(p1 - q1) + 3) >> 3
  SignedShift8b_SSE2(&t3);           // (3 * (q0 - p0) + hev(p1 - q1) + 4) >> 3
  *p0 = _mm_adds_epi8(*p0, t2);      // p0 += t2
  *q0 = _mm_subs_epi8(*q0, t3);      // q0 -= t3
  FLIP_SIGN_BIT2(*p0, *q0);

  // this is equivalent to signed (a + 1) >> 1 calculation
  t2 = _mm_add_epi8(t3, sign_bit);
  t3 = _mm_avg_epu8(t2, zero);
  t3 = _mm_sub_epi8(t3, k64);

  t3 = _mm_and_si128(not_hev, t3);   // if !hev
  *q1 = _mm_subs_epi8(*q1, t3);      // q1 -= t3
  *p1 = _mm_adds_epi8(*p1, t3);      // p1 += t3
  FLIP_SIGN_BIT2(*p1, *q1);
}